

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintMessageDescriptors
          (Generator *this,StripPrintDescriptor print_mode)

{
  FileDescriptor *pFVar1;
  long lVar2;
  long lVar3;
  
  pFVar1 = this->file_;
  if (print_mode == kCreate) {
    if (0 < *(int *)(pFVar1 + 0x2c)) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        PrintCreateDescriptor(this,(Descriptor *)(*(long *)(pFVar1 + 0x58) + lVar3));
        io::Printer::Print<>(this->printer_,"\n");
        lVar2 = lVar2 + 1;
        pFVar1 = this->file_;
        lVar3 = lVar3 + 0x88;
      } while (lVar2 < *(int *)(pFVar1 + 0x2c));
    }
  }
  else if (0 < *(int *)(pFVar1 + 0x2c)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      PrintFindDescriptor(this,(Descriptor *)(*(long *)(pFVar1 + 0x58) + lVar2));
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0x88;
    } while (lVar3 < *(int *)(pFVar1 + 0x2c));
  }
  return;
}

Assistant:

void Generator::PrintMessageDescriptors(StripPrintDescriptor print_mode) const {
  if (print_mode == StripPrintDescriptor::kCreate) {
    for (int i = 0; i < file_->message_type_count(); ++i) {
      PrintCreateDescriptor(*file_->message_type(i));
      printer_->Print("\n");
    }
  } else {
    for (int i = 0; i < file_->message_type_count(); ++i) {
      PrintFindDescriptor(*file_->message_type(i));
    }
  }
}